

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  ImChunkStream<ImGuiWindowSettings> *this;
  ImGuiWindow *pIVar1;
  char *pcVar2;
  int iVar3;
  ImGuiWindow **ppIVar4;
  ImGuiWindowSettings *pIVar5;
  int iVar6;
  
  this = &ctx->SettingsWindows;
  iVar6 = 0;
  do {
    if (iVar6 == (ctx->Windows).Size) {
      iVar6 = (buf->Buf).Size;
      iVar3 = iVar6 + -1;
      if (iVar6 == 0) {
        iVar3 = 0;
      }
      ImVector<char>::reserve(&buf->Buf,(ctx->SettingsWindows).Buf.Size * 6 + iVar3);
      pcVar2 = (ctx->SettingsWindows).Buf.Data;
      pIVar5 = (ImGuiWindowSettings *)(pcVar2 + 4);
      if (pcVar2 == (char *)0x0) {
        pIVar5 = (ImGuiWindowSettings *)0x0;
      }
      for (; pIVar5 != (ImGuiWindowSettings *)0x0;
          pIVar5 = ImChunkStream<ImGuiWindowSettings>::next_chunk(this,pIVar5)) {
        ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pIVar5 + 1);
        ImGuiTextBuffer::appendf
                  (buf,"Pos=%d,%d\n",(ulong)(uint)(int)(pIVar5->Pos).x,
                   (ulong)(uint)(int)(pIVar5->Pos).y);
        ImGuiTextBuffer::appendf
                  (buf,"Size=%d,%d\n",(ulong)(uint)(int)(pIVar5->Size).x,
                   (ulong)(uint)(int)(pIVar5->Size).y);
        ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)pIVar5->Collapsed);
        ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
      }
      return;
    }
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](&ctx->Windows,iVar6);
    pIVar1 = *ppIVar4;
    if ((pIVar1->Flags & 0x100) == 0) {
      if (pIVar1->SettingsOffset == -1) {
        pIVar5 = ImGui::FindWindowSettings(pIVar1->ID);
      }
      else {
        pIVar5 = ImChunkStream<ImGuiWindowSettings>::ptr_from_offset(this,pIVar1->SettingsOffset);
      }
      if (pIVar5 == (ImGuiWindowSettings *)0x0) {
        pIVar5 = ImGui::CreateNewWindowSettings(pIVar1->Name);
        iVar3 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr(this,pIVar5);
        pIVar1->SettingsOffset = iVar3;
      }
      if (pIVar5->ID != pIVar1->ID) {
        __assert_fail("settings->ID == window->ID",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                      ,0x28bc,
                      "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                     );
      }
      pIVar5->Pos = (ImVec2ih)((int)(pIVar1->Pos).x & 0xffffU | (int)(pIVar1->Pos).y << 0x10);
      pIVar5->Size = (ImVec2ih)
                     ((int)(pIVar1->SizeFull).x & 0xffffU | (int)(pIVar1->SizeFull).y << 0x10);
      pIVar5->Collapsed = pIVar1->Collapsed;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->append("\n");
    }
}